

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O0

double iDynTree::distanceBetweenPointAndSegment
                 (Vector2 *point,Vector2 *segmentFirstPoint,Vector2 *segmentLastPoint)

{
  double *pdVar1;
  ReturnType RVar2;
  Vector2 closestPoint;
  double tClosestPoint;
  double tProjection;
  double segmentLengthSquared;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  *in_stack_fffffffffffffdb8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffdc0;
  VectorFixSize<2U> *in_stack_fffffffffffffdd8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffde0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffde8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffdf0;
  Vector2 *in_stack_fffffffffffffdf8;
  StorageBaseType *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  VectorFixSize<2U> local_130;
  double local_120;
  double local_118;
  double local_110;
  double local_78 [10];
  RealScalar local_28;
  double local_8;
  
  toEigen<2U>(in_stack_fffffffffffffdd8);
  toEigen<2U>(in_stack_fffffffffffffdd8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>>::
  operator-(in_stack_fffffffffffffde8,
            (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_stack_fffffffffffffde0);
  local_28 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
             ::squaredNorm(in_stack_fffffffffffffdf0);
  if ((local_28 != 0.0) || (NAN(local_28))) {
    toEigen<2U>(in_stack_fffffffffffffdd8);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>>::
    operator-(in_stack_fffffffffffffde8,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffde0);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>>::
    operator-(in_stack_fffffffffffffde8,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffde0);
    RVar2 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>const>>
            ::
            dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>const>>
                      (in_stack_fffffffffffffdc0,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)in_stack_fffffffffffffdb8);
    local_78[0] = RVar2 / local_28;
    local_118 = 0.0;
    local_120 = 1.0;
    pdVar1 = std::min<double>(&local_120,local_78);
    pdVar1 = std::max<double>(&local_118,pdVar1);
    local_110 = *pdVar1;
    VectorFixSize<2U>::VectorFixSize(&local_130);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>>::
    operator-(in_stack_fffffffffffffde8,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffde0);
    Eigen::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>const,0,Eigen::Stride<0,0>>>::
    operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    toEigen<2U>(in_stack_fffffffffffffdd8);
    Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_8 = distanceBetweentTwoPoints
                        ((Vector2 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  else {
    local_8 = distanceBetweentTwoPoints
                        ((Vector2 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  return local_8;
}

Assistant:

double distanceBetweenPointAndSegment(const Vector2& point,
                                          const Vector2& segmentFirstPoint,
                                          const Vector2& segmentLastPoint)
    {
        double segmentLengthSquared = (toEigen(segmentLastPoint)-toEigen(segmentFirstPoint)).squaredNorm();

        // First case: the segment is actually a point
        if (segmentLengthSquared == 0.0)
        {
            return distanceBetweentTwoPoints(point, segmentFirstPoint);
        }

        // The segment can be written as the set of segment points sp that can be written as:
        // sp = segmentFirstPoint + t*( segmentLastPoint - segmentFirstPoint )
        // for t \in [0, 1]
        // To find the segment point closest to the point, we can just find the t of the projection
        // of the point in the segment, and clamp it to [0, 1]
        double tProjection = ((toEigen(point)-toEigen(segmentFirstPoint)).dot(toEigen(segmentLastPoint)-toEigen(segmentFirstPoint)))/segmentLengthSquared;

        double tClosestPoint = std::max(0.0, std::min(1.0, tProjection));

        Vector2 closestPoint;
        toEigen(closestPoint) = toEigen(segmentFirstPoint) + tClosestPoint*(toEigen(segmentLastPoint)-toEigen(segmentFirstPoint));

        return distanceBetweentTwoPoints(point, closestPoint);
    }